

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O2

void __thiscall
Hospital::Update_Patient_File
          (Hospital *this,vector<Patient,_std::allocator<Patient>_> *All_Of_Patients,
          ofstream *inFile)

{
  ostream *poVar1;
  ulong uVar2;
  long lVar3;
  pointer pPVar4;
  ulong uVar5;
  long lVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_248;
  ofstream abus;
  
  system("pause");
  std::ofstream::ofstream(&abus);
  std::ofstream::open((char *)&abus,0x11c14b);
  for (uVar2 = 0;
      pPVar4 = (All_Of_Patients->super__Vector_base<Patient,_std::allocator<Patient>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar2 < (ulong)(((long)(All_Of_Patients->super__Vector_base<Patient,_std::allocator<Patient>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pPVar4) / 0x150);
      uVar2 = uVar2 + 1) {
    lVar3 = 0;
    uVar5 = 0;
    while( true ) {
      Patient::patient_all_ino_getter_abi_cxx11_(&local_248,pPVar4 + uVar2);
      lVar6 = (long)local_248.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_248.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_248);
      if ((ulong)(lVar6 >> 5) <= uVar5) break;
      Patient::patient_all_ino_getter_abi_cxx11_
                (&local_248,
                 (All_Of_Patients->super__Vector_base<Patient,_std::allocator<Patient>_>)._M_impl.
                 super__Vector_impl_data._M_start + uVar2);
      poVar1 = std::operator<<((ostream *)&abus,
                               (string *)
                               ((long)&((local_248.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar3));
      std::operator<<(poVar1," ");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_248);
      uVar5 = uVar5 + 1;
      pPVar4 = (All_Of_Patients->super__Vector_base<Patient,_std::allocator<Patient>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x20;
    }
    std::operator<<((ostream *)&abus,"\n");
  }
  std::ofstream::~ofstream(&abus);
  return;
}

Assistant:

void Hospital:: Update_Patient_File ( vector<Patient>&All_Of_Patients , ofstream& inFile) {
    system("pause");
    //  cout << "hiiiii";
    ofstream abus;
    abus.open("Patients.txt");
    //abus <<"Asghar";

    for (int i = 0; i < All_Of_Patients.size(); i++) {
        for (int j = 0; j < All_Of_Patients[i].patient_all_ino_getter().size(); ++j) {
            abus << All_Of_Patients[i].patient_all_ino_getter()[j] << " ";
//            abus <<"Asghar";
        }
        abus << "\n";
    }
    //inFile.close();

}